

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NFiles.cpp
# Opt level: O2

Vector<int,_std::allocator<int>_> * __thiscall
amrex::NFilesIter::FileNumbersWritten
          (Vector<int,_std::allocator<int>_> *__return_storage_ptr__,NFilesIter *this)

{
  pointer pVVar1;
  long lVar2;
  pointer piVar3;
  undefined4 in_EAX;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 uStack_18;
  value_type_conflict local_14;
  
  _uStack_18 = CONCAT44(0xffffffff,in_EAX);
  std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,(long)this->nProcs,
             &local_14,(allocator_type *)((long)&uStack_18 + 3));
  if (this->myProc == this->coordinatorProc) {
    pVVar1 = (this->fileNumbersWriteOrder).
             super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
             .
             super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = ((long)(this->fileNumbersWriteOrder).
                   super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x18;
    if (lVar4 < 1) {
      lVar4 = 0;
    }
    for (lVar5 = 0; lVar5 != lVar4; lVar5 = lVar5 + 1) {
      lVar2 = *(long *)&pVVar1[lVar5].super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>;
      lVar6 = (long)*(pointer *)
                     ((long)&pVVar1[lVar5].super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_> + 8) - lVar2 >> 2;
      piVar3 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (lVar6 < 1) {
        lVar6 = 0;
      }
      for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
        piVar3[*(int *)(lVar2 + lVar7 * 4)] = (int)lVar5;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<int> NFilesIter::FileNumbersWritten()
{
  Vector<int> fileNumbersWritten(nProcs, -1);

  if(myProc == coordinatorProc) {

#if 0
    int total(0);
    std::set<int> procSet;
    for(int f(0); f < fileNumbersWriteOrder.size(); ++f) {
      total += fileNumbersWriteOrder[f].size();
      for(int r(0); r < fileNumbersWriteOrder[f].size(); ++r) {
        procSet.insert(fileNumbersWriteOrder[f][r]);
      }
    }
    if(total != nProcs || static_cast<int>(procSet.size()) != nProcs) {
      amrex::AllPrint() << "**** Error in NFilesIter::FileNumbersWritten():  "
                << " coordinatorProc nProcs total procSet.size() = "
                << coordinatorProc << "  " << nProcs << "  "
                << total << "  " << procSet.size() << std::endl;
    }
#endif

    for(int f(0); f < fileNumbersWriteOrder.size(); ++f) {
      for(int r(0); r < fileNumbersWriteOrder[f].size(); ++r) {
        fileNumbersWritten[fileNumbersWriteOrder[f][r]] = f;
      }
    }

  }
  return fileNumbersWritten;
}